

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O3

Error __thiscall asmjit::VMemMgr::release(VMemMgr *this,void *p)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *puVar3;
  RbNode *pRVar4;
  size_t sVar5;
  MemNode *pMVar6;
  int iVar7;
  ulong uVar8;
  size_t *psVar9;
  MemNode *pMVar10;
  long lVar11;
  MemNode *pMVar12;
  MemNode *pMVar13;
  MemNode *pMVar14;
  size_t *psVar15;
  RbNode *pRVar16;
  Error EVar17;
  ulong uVar18;
  RbNode **ppRVar19;
  MemNode **ppMVar20;
  size_t sVar21;
  MemNode **ppMVar22;
  ulong uVar23;
  uint uVar24;
  MemNode *__ptr;
  RbNode *pRVar25;
  MemNode *pMVar26;
  bool bVar27;
  RbNode local_58;
  
  if (p == (void *)0x0) {
    return 0;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  EVar17 = 3;
  for (pMVar26 = this->_root; pMVar26 != (MemNode *)0x0;
      pMVar26 = (MemNode *)(pMVar26->super_RbNode).node[0]) {
    puVar1 = (pMVar26->super_RbNode).mem;
    if (puVar1 <= p) {
      if (p < puVar1 + pMVar26->size) {
        lVar11 = 0;
        uVar8 = (ulong)((long)p - (long)puVar1) / pMVar26->density;
        uVar18 = 1L << (uVar8 & 0x3f);
        uVar8 = uVar8 >> 6;
        psVar15 = pMVar26->baUsed + uVar8;
        psVar9 = pMVar26->baCont + uVar8;
        goto LAB_0015ff56;
      }
      pMVar26 = (MemNode *)((pMVar26->super_RbNode).node + 1);
    }
  }
  goto LAB_00160257;
LAB_0015ff56:
  sVar21 = *psVar15;
  sVar2 = *psVar9;
  do {
    uVar23 = sVar2;
    uVar8 = uVar18;
    sVar21 = ~uVar8 & sVar21;
    lVar11 = lVar11 + 1;
    if ((uVar8 & uVar23) == 0) break;
    uVar18 = uVar8 * 2;
    sVar2 = ~uVar8 & uVar23;
  } while (uVar8 * 2 != 0);
  *psVar15 = sVar21;
  *psVar9 = ~uVar8 & uVar23;
  if ((uVar8 & uVar23) == 0) goto LAB_0015ff96;
  psVar15 = psVar15 + 1;
  psVar9 = psVar9 + 1;
  uVar18 = 1;
  goto LAB_0015ff56;
LAB_0015ff96:
  sVar21 = pMVar26->size;
  sVar2 = pMVar26->used;
  if (sVar2 == sVar21) {
    pMVar14 = this->_optimal;
    do {
      pMVar14 = pMVar14->prev;
      if (pMVar14 == pMVar26) {
        this->_optimal = pMVar26;
        break;
      }
    } while (pMVar14 != (MemNode *)0x0);
  }
  uVar18 = lVar11 * pMVar26->density;
  if (pMVar26->largestBlock < uVar18) {
    pMVar26->largestBlock = uVar18;
  }
  pMVar26->used = sVar2 - uVar18;
  this->_usedBytes = this->_usedBytes - uVar18;
  if (sVar2 != uVar18) {
LAB_00160255:
    EVar17 = 0;
LAB_00160257:
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return EVar17;
  }
  OSUtils::releaseVirtualMemory(puVar1,sVar21);
  free(pMVar26->baUsed);
  pMVar26->baUsed = (size_t *)0x0;
  pMVar26->baCont = (size_t *)0x0;
  this->_allocatedBytes = this->_allocatedBytes - pMVar26->size;
  pMVar14 = this->_root;
  local_58 = (RbNode)(ZEXT832(pMVar14) << 0x40);
  if (pMVar14 == (MemNode *)0x0) goto LAB_00160285;
  ppRVar19 = (RbNode **)((long)register0x00000020 + -0x50);
  pMVar10 = (MemNode *)0x0;
  pMVar12 = (MemNode *)0x0;
  pMVar6 = (MemNode *)&stack0xffffffffffffffa8;
  uVar18 = 1;
  do {
    __ptr = pMVar14;
    pMVar13 = pMVar6;
    puVar1 = (__ptr->super_RbNode).mem;
    puVar3 = (pMVar26->super_RbNode).mem;
    uVar8 = (ulong)(puVar1 < puVar3);
    if (__ptr == pMVar26) {
      pMVar10 = __ptr;
    }
    if (((__ptr->super_RbNode).red == 0) &&
       ((pRVar25 = (__ptr->super_RbNode).node[uVar8], pRVar25 == (RbNode *)0x0 ||
        (pRVar25->red == 0)))) {
      pMVar14 = (MemNode *)(__ptr->super_RbNode).node[puVar3 <= puVar1];
      if ((pMVar14 == (MemNode *)0x0) || ((pMVar14->super_RbNode).red == 0)) {
        uVar24 = (uint)uVar18 ^ 1;
        pRVar25 = (pMVar13->super_RbNode).node[uVar24];
        if (pRVar25 != (RbNode *)0x0) {
          if ((pRVar25->node[uVar24] == (RbNode *)0x0) || (pRVar25->node[uVar24]->red == 0)) {
            if ((pRVar25->node[uVar18] != (RbNode *)0x0) && (pRVar25->node[uVar18]->red != 0)) {
              bVar27 = (MemNode *)(pMVar12->super_RbNode).node[1] == pMVar13;
              goto LAB_00160116;
            }
            (pMVar13->super_RbNode).red = 0;
            pRVar25->red = 1;
            (__ptr->super_RbNode).red = 1;
          }
          else {
            ppRVar19 = pRVar25->node + uVar18;
            bVar27 = (MemNode *)(pMVar12->super_RbNode).node[1] == pMVar13;
            pRVar16 = *ppRVar19;
            if ((pRVar16 != (RbNode *)0x0) && (pRVar16->red != 0)) {
LAB_00160116:
              pRVar4 = pRVar25->node[uVar18];
              pRVar25->node[uVar18] = pRVar4->node[uVar24];
              ppRVar19 = pRVar4->node + uVar18;
              pRVar4->node[uVar24] = pRVar25;
              pRVar25->red = 1;
              (pMVar13->super_RbNode).node[uVar24] = pRVar4;
              pRVar16 = *ppRVar19;
              pRVar25 = pRVar4;
            }
            (pMVar13->super_RbNode).node[uVar24] = pRVar16;
            *ppRVar19 = &pMVar13->super_RbNode;
            (pMVar13->super_RbNode).red = 1;
            (pMVar12->super_RbNode).node[bVar27] = pRVar25;
            pRVar16 = pRVar25->node[0];
            pRVar4 = pRVar25->node[1];
            pRVar25->red = 1;
            (__ptr->super_RbNode).red = 1;
            pRVar16->red = 0;
            pRVar4->red = 0;
          }
        }
      }
      else {
        (__ptr->super_RbNode).node[puVar3 <= puVar1] = (pMVar14->super_RbNode).node[uVar8];
        (pMVar14->super_RbNode).node[uVar8] = &__ptr->super_RbNode;
        (__ptr->super_RbNode).red = 1;
        (pMVar14->super_RbNode).red = 0;
        *ppRVar19 = (RbNode *)pMVar14;
        pMVar13 = pMVar14;
      }
    }
    ppRVar19 = (__ptr->super_RbNode).node + uVar8;
    pMVar12 = pMVar13;
    pMVar6 = __ptr;
    uVar18 = uVar8;
    pMVar14 = (MemNode *)*ppRVar19;
  } while ((MemNode *)*ppRVar19 != (MemNode *)0x0);
  if (pMVar10 == (MemNode *)0x0) goto LAB_00160285;
  if (pMVar10 == (MemNode *)&stack0xffffffffffffffa8) {
    release();
LAB_00160278:
    release();
  }
  else {
    if (__ptr == (MemNode *)&stack0xffffffffffffffa8) goto LAB_00160278;
    if (pMVar10 != __ptr) {
      (pMVar10->super_RbNode).mem = (__ptr->super_RbNode).mem;
      sVar21 = __ptr->used;
      sVar2 = __ptr->blocks;
      sVar5 = __ptr->density;
      pMVar10->size = __ptr->size;
      pMVar10->used = sVar21;
      pMVar10->blocks = sVar2;
      pMVar10->density = sVar5;
      pMVar10->largestBlock = __ptr->largestBlock;
      psVar9 = __ptr->baCont;
      pMVar10->baUsed = __ptr->baUsed;
      pMVar10->baCont = psVar9;
    }
    (pMVar13->super_RbNode).node[(MemNode *)(pMVar13->super_RbNode).node[1] == __ptr] =
         (__ptr->super_RbNode).node[(__ptr->super_RbNode).node[0] == (RbNode *)0x0];
    this->_root = (MemNode *)local_58.node[1];
    if ((MemNode *)local_58.node[1] != (MemNode *)0x0) {
      (((MemNode *)local_58.node[1])->super_RbNode).red = 0;
    }
    pMVar26 = __ptr->prev;
    pMVar14 = __ptr->next;
    ppMVar20 = &pMVar26->next;
    if (pMVar26 == (MemNode *)0x0) {
      ppMVar20 = &this->_first;
    }
    ppMVar22 = &pMVar14->prev;
    if (pMVar14 == (MemNode *)0x0) {
      ppMVar22 = &this->_last;
    }
    *ppMVar20 = pMVar14;
    *ppMVar22 = pMVar26;
    if (this->_optimal == __ptr) {
      if (pMVar26 != (MemNode *)0x0) {
        pMVar14 = pMVar26;
      }
      this->_optimal = pMVar14;
    }
    free(__ptr);
    iVar7 = rbAssert(&this->_root->super_RbNode);
    if (0 < iVar7) goto LAB_00160255;
  }
  release();
LAB_00160285:
  release();
}

Assistant:

Error VMemMgr::release(void* p) noexcept {
  if (!p) return kErrorOk;

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, static_cast<uint8_t*>(p));
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  bool stop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // If the freed block is fully allocated node then it's needed to
  // update 'optimal' pointer in memory manager.
  if (node->used == node->size) {
    MemNode* cur = _optimal;

    do {
      cur = cur->prev;
      if (cur == node) {
        _optimal = node;
        break;
      }
    } while (cur);
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  // If page is empty, we can free it.
  if (node->used == 0) {
    // Free memory associated with node (this memory is not accessed
    // anymore so it's safe).
    vMemMgrReleaseVMem(this, node->mem, node->size);
    Internal::releaseMemory(node->baUsed);

    node->baUsed = nullptr;
    node->baCont = nullptr;

    // Statistics.
    _allocatedBytes -= node->size;

    // Remove node. This function can return different node than
    // passed into, but data is copied into previous node if needed.
    Internal::releaseMemory(vMemMgrRemoveNode(this, node));
    ASMJIT_ASSERT(vMemMgrCheckTree(this));
  }

  return kErrorOk;
}